

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int send_new_connection_id
              (quicly_conn_t *conn,quicly_send_context_t *s,st_quicly_local_cid_t *new_cid)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  size_t len;
  undefined8 uVar5;
  quicly_sent_t *pqVar6;
  quicly_cid_t *_src;
  quicly_sent_acked_cb p_Var7;
  int iVar8;
  int iVar9;
  uint8_t *puVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  size_t asStack_b0 [3];
  char acStack_98 [40];
  long lStack_70;
  char acStack_68 [8];
  quicly_sent_t *local_60;
  quicly_sent_t *sent;
  quicly_cid_t *local_50;
  quicly_sent_acked_cb local_48;
  uint64_t local_40;
  int local_34;
  
  uVar13 = new_cid->sequence;
  if (uVar13 < 0x40) {
    lStack_70 = 4;
  }
  else if (uVar13 < 0x4000) {
    lStack_70 = 5;
  }
  else {
    lStack_70 = (ulong)(0x3fffffff < uVar13) * 4 + 7;
  }
  lVar1 = (ulong)(new_cid->cid).len + lStack_70;
  lStack_70 = 0x1210e4;
  iVar8 = allocate_ack_eliciting_frame(conn,s,lVar1 + 0x10,&local_60,on_ack_new_connection_id);
  if (iVar8 == 0) {
    uVar4 = new_cid->sequence;
    (local_60->data).packet.packet_number = uVar4;
    puVar10 = s->dst;
    bVar2 = (new_cid->cid).len;
    uVar13 = (ulong)bVar2;
    *puVar10 = '\x18';
    lStack_70 = 0x121118;
    sent = (quicly_sent_t *)conn;
    local_34 = iVar8;
    puVar10 = ptls_encode_quicint(puVar10 + 1,uVar4);
    iVar8 = local_34;
    *puVar10 = '\0';
    puVar10[1] = bVar2;
    lStack_70 = 0x121139;
    local_50 = &new_cid->cid;
    memcpy(puVar10 + 2,&new_cid->cid,uVar13);
    pqVar6 = sent;
    uVar5 = *(undefined8 *)(new_cid->stateless_reset_token + 8);
    *(undefined8 *)(puVar10 + uVar13 + 2) = *(undefined8 *)new_cid->stateless_reset_token;
    *(undefined8 *)(puVar10 + uVar13 + 10) = uVar5;
    s->dst = puVar10 + uVar13 + 0x12;
    sent[0x20].acked = sent[0x20].acked + 1;
    if (quicly_trace_fp != (FILE *)0x0) {
      lStack_70 = 0x121187;
      iVar9 = ptls_skip_tracing((ptls_t *)sent[0x45].data.packet.sent_at);
      _src = local_50;
      if (iVar9 == 0) {
        local_48 = pqVar6[0x4e].acked;
        local_40 = new_cid->sequence;
        bVar2 = (new_cid->cid).len;
        lVar1 = -(ulong)((uint)bVar2 * 2 + 0x10 & 0xfffffff0);
        *(undefined8 *)((long)&lStack_70 + lVar1) = 0x1211c3;
        pcVar11 = ptls_hexdump(acStack_68 + lVar1,_src,(ulong)bVar2);
        *(undefined8 *)((long)asStack_b0 + lVar1 + 0x10) = 0x10;
        len = *(size_t *)((long)asStack_b0 + lVar1 + 0x10);
        *(undefined8 *)((long)asStack_b0 + lVar1 + 0x10) = 0x1211d9;
        pcVar12 = ptls_hexdump(acStack_98 + lVar1,new_cid->stateless_reset_token,len);
        uVar4 = local_40;
        p_Var7 = local_48;
        uVar3 = *(uint *)((long)&pqVar6->data + 8);
        *(char **)((long)asStack_b0 + lVar1 + 0x10) = pcVar12;
        *(char **)((long)asStack_b0 + lVar1 + 8) = pcVar11;
        *(undefined8 *)((long)asStack_b0 + lVar1) = 0x121200;
        fprintf((FILE *)quicly_trace_fp,
                "{\"type\":\"new-connection-id-send\", \"conn\":%u, \"time\":%lld, \"sequence\":%llu, \"retire-prior-to\":%llu, \"cid\":\"%s\", \"stateless-reset-token\":\"%s\"}\n"
                ,(ulong)uVar3,p_Var7,uVar4,0);
      }
    }
  }
  return iVar8;
}

Assistant:

static int send_new_connection_id(quicly_conn_t *conn, quicly_send_context_t *s, struct st_quicly_local_cid_t *new_cid)
{
    int ret;
    quicly_sent_t *sent;
    uint64_t retire_prior_to = 0; /* TODO */

    ret = allocate_ack_eliciting_frame(
        conn, s, quicly_new_connection_id_frame_capacity(new_cid->sequence, retire_prior_to, new_cid->cid.len), &sent,
        on_ack_new_connection_id);
    if (ret != 0)
        return ret;
    sent->data.new_connection_id.sequence = new_cid->sequence;

    s->dst = quicly_encode_new_connection_id_frame(s->dst, new_cid->sequence, retire_prior_to, new_cid->cid.cid, new_cid->cid.len,
                                                   new_cid->stateless_reset_token);

    ++conn->super.stats.num_frames_sent.new_connection_id;
    QUICLY_PROBE(NEW_CONNECTION_ID_SEND, conn, conn->stash.now, new_cid->sequence, retire_prior_to,
                 QUICLY_PROBE_HEXDUMP(new_cid->cid.cid, new_cid->cid.len),
                 QUICLY_PROBE_HEXDUMP(new_cid->stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN));

    return 0;
}